

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcRamp::~IfcRamp(IfcRamp *this)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  
  *(undefined8 *)this = 0x904500;
  *(undefined8 *)&this->field_0x178 = 0x904618;
  *(undefined8 *)&this->field_0x88 = 0x904528;
  *(undefined8 *)&this->field_0x98 = 0x904550;
  *(undefined8 *)&this->field_0xd0 = 0x904578;
  *(undefined8 *)&this->field_0x100 = 0x9045a0;
  *(undefined8 *)&this->field_0x138 = 0x9045c8;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRamp,_1UL>)._vptr_ObjectHelper =
       (_func_int **)0x9045f0;
  puVar2 = *(undefined1 **)
            &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRamp,_1UL>).field_0x10;
  puVar1 = &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRamp,_1UL>).field_0x20;
  if (puVar2 != puVar1) {
    operator_delete(puVar2,*(long *)puVar1 + 1);
  }
  IfcElement::~IfcElement((IfcElement *)this,&PTR_construction_vtable_24__00904638);
  return;
}

Assistant:

IfcRamp() : Object("IfcRamp") {}